

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbf.cpp
# Opt level: O2

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
GetEntriesForConflicts_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,CTransaction *tx,CTxMemPool *pool,setEntries *iters_conflicting,
          setEntries *all_conflicts)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  pointer pcVar3;
  uint *in_R9;
  iterator __begin1;
  _Rb_tree_header *p_Var4;
  long in_FS_OFFSET;
  uint256 txid;
  undefined1 local_a0 [8];
  string local_98;
  string local_78;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = *(undefined8 *)(tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
  uStack_50 = *(undefined8 *)((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  local_48 = *(undefined8 *)((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  uStack_40 = *(undefined8 *)((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  p_Var2 = (iters_conflicting->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var4 = &(iters_conflicting->_M_t)._M_impl.super__Rb_tree_header;
  pcVar3 = (pointer)0x0;
  p_Var1 = p_Var2;
  do {
    if ((_Rb_tree_header *)p_Var1 == p_Var4) {
      for (; (_Rb_tree_header *)p_Var2 != p_Var4;
          p_Var2 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var2)) {
        CTxMemPool::CalculateDescendants
                  (pool,*(hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
                          **)(p_Var2 + 1),all_conflicts);
      }
      (__return_storage_ptr__->
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = false;
LAB_007cb979:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return __return_storage_ptr__;
      }
      __stack_chk_fail();
    }
    pcVar3 = pcVar3 + *(long *)(*(long *)(p_Var1 + 1) + 200);
    if ((pointer)0x64 < pcVar3) {
      local_a0 = (undefined1  [8])pcVar3;
      base_blob<256u>::ToString_abi_cxx11_((string *)(local_a0 + 8),(base_blob<256u> *)&local_58);
      tinyformat::format<std::__cxx11::string,unsigned_long,unsigned_int>
                (&local_78,
                 (tinyformat *)
                 "rejecting replacement %s; too many potential replacements (%d > %d)\n",
                 (char *)(local_a0 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                 (unsigned_long *)&MAX_REPLACEMENT_CANDIDATES,in_R9);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (__return_storage_ptr__,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)(local_a0 + 8));
      goto LAB_007cb979;
    }
    p_Var1 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var1);
  } while( true );
}

Assistant:

std::optional<std::string> GetEntriesForConflicts(const CTransaction& tx,
                                                  CTxMemPool& pool,
                                                  const CTxMemPool::setEntries& iters_conflicting,
                                                  CTxMemPool::setEntries& all_conflicts)
{
    AssertLockHeld(pool.cs);
    const uint256 txid = tx.GetHash();
    uint64_t nConflictingCount = 0;
    for (const auto& mi : iters_conflicting) {
        nConflictingCount += mi->GetCountWithDescendants();
        // Rule #5: don't consider replacing more than MAX_REPLACEMENT_CANDIDATES
        // entries from the mempool. This potentially overestimates the number of actual
        // descendants (i.e. if multiple conflicts share a descendant, it will be counted multiple
        // times), but we just want to be conservative to avoid doing too much work.
        if (nConflictingCount > MAX_REPLACEMENT_CANDIDATES) {
            return strprintf("rejecting replacement %s; too many potential replacements (%d > %d)\n",
                             txid.ToString(),
                             nConflictingCount,
                             MAX_REPLACEMENT_CANDIDATES);
        }
    }
    // Calculate the set of all transactions that would have to be evicted.
    for (CTxMemPool::txiter it : iters_conflicting) {
        pool.CalculateDescendants(it, all_conflicts);
    }
    return std::nullopt;
}